

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator.cpp
# Opt level: O3

string * __thiscall
duckdb::LogicalOperator::ColumnBindingsToString_abi_cxx11_
          (string *__return_storage_ptr__,LogicalOperator *this,
          vector<duckdb::ColumnBinding,_true> *bindings)

{
  string *psVar1;
  const_reference this_00;
  size_type __n;
  string result;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  string *local_58;
  string local_50;
  
  local_78 = local_68;
  local_58 = __return_storage_ptr__;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"{","");
  if (*(_func_int ***)&this->type != this->_vptr_LogicalOperator) {
    __n = 0;
    do {
      if (__n != 0) {
        ::std::__cxx11::string::append((char *)&local_78);
      }
      this_00 = vector<duckdb::ColumnBinding,_true>::operator[]
                          ((vector<duckdb::ColumnBinding,_true> *)this,__n);
      ColumnBinding::ToString_abi_cxx11_(&local_50,this_00);
      ::std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      __n = __n + 1;
    } while (__n < (ulong)(*(long *)&this->type - (long)this->_vptr_LogicalOperator >> 4));
  }
  psVar1 = local_58;
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)local_58,local_78,local_78 + local_70);
  ::std::__cxx11::string::append((char *)psVar1);
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  return psVar1;
}

Assistant:

string LogicalOperator::ColumnBindingsToString(const vector<ColumnBinding> &bindings) {
	string result = "{";
	for (idx_t i = 0; i < bindings.size(); i++) {
		if (i != 0) {
			result += ", ";
		}
		result += bindings[i].ToString();
	}
	return result + "}";
}